

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopher.c
# Opt level: O2

CURLcode gopher_do(connectdata *conn,_Bool *done)

{
  curl_socket_t sockfd;
  Curl_easy *pCVar1;
  char *pcVar2;
  CURLcode CVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  char *sel;
  char *local_50;
  Curl_easy *local_48;
  size_t len;
  ssize_t amount;
  
  pCVar1 = conn->data;
  sockfd = conn->sock[0];
  pcVar5 = (pCVar1->state).up.path;
  pcVar2 = (pCVar1->state).up.query;
  sel = (char *)0x0;
  *done = true;
  if (pcVar2 == (char *)0x0) {
    pcVar5 = (*Curl_cstrdup)(pcVar5);
  }
  else {
    pcVar5 = curl_maprintf("%s?%s",pcVar5);
  }
  if (pcVar5 == (char *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar6 = strlen(pcVar5);
    local_48 = pCVar1;
    if (sVar6 < 3) {
      sel = "";
      len = 0;
      (*Curl_cfree)(pcVar5);
      local_50 = (char *)0x0;
      sVar7 = 0;
    }
    else {
      CVar3 = Curl_urldecode(pCVar1,pcVar5 + 2,0,&sel,&len,false);
      (*Curl_cfree)(pcVar5);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      local_50 = sel;
      sVar7 = len;
    }
    sVar7 = curlx_uztosz(sVar7);
    do {
      CVar3 = Curl_write(conn,sockfd,sel,sVar7,&amount);
      if ((CVar3 != CURLE_OK) || (CVar3 = Curl_client_write(conn,2,sel,amount), CVar3 != CURLE_OK))
      goto LAB_00134cf1;
      sel = sel + amount;
      sVar8 = sVar7 - amount;
      if (sVar8 == 0 || (long)sVar7 < amount) {
        CVar3 = CURLE_OK;
        goto LAB_00134cf1;
      }
      iVar4 = Curl_socket_check(-1,-1,sockfd,100);
      sVar7 = sVar8;
    } while (-1 < iVar4);
    CVar3 = CURLE_SEND_ERROR;
LAB_00134cf1:
    (*Curl_cfree)(local_50);
    pCVar1 = local_48;
    if ((CVar3 == CURLE_OK) && (CVar3 = Curl_sendf(sockfd,conn,"\r\n"), CVar3 == CURLE_OK)) {
      CVar3 = Curl_client_write(conn,2,"\r\n",2);
      if (CVar3 == CURLE_OK) {
        CVar3 = CURLE_OK;
        Curl_setup_transfer(pCVar1,0,-1,false,-1);
      }
    }
    else {
      Curl_failf(pCVar1,"Failed sending Gopher request");
    }
  }
  return CVar3;
}

Assistant:

static CURLcode gopher_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
  char *gopherpath;
  char *path = data->state.up.path;
  char *query = data->state.up.query;
  char *sel = NULL;
  char *sel_org = NULL;
  ssize_t amount, k;
  size_t len;

  *done = TRUE; /* unconditionally */

  /* path is guaranteed non-NULL */
  DEBUGASSERT(path);

  if(query)
    gopherpath = aprintf("%s?%s", path, query);
  else
    gopherpath = strdup(path);

  if(!gopherpath)
    return CURLE_OUT_OF_MEMORY;

  /* Create selector. Degenerate cases: / and /1 => convert to "" */
  if(strlen(gopherpath) <= 2) {
    sel = (char *)"";
    len = strlen(sel);
    free(gopherpath);
  }
  else {
    char *newp;

    /* Otherwise, drop / and the first character (i.e., item type) ... */
    newp = gopherpath;
    newp += 2;

    /* ... and finally unescape */
    result = Curl_urldecode(data, newp, 0, &sel, &len, FALSE);
    free(gopherpath);
    if(result)
      return result;
    sel_org = sel;
  }

  /* We use Curl_write instead of Curl_sendf to make sure the entire buffer is
     sent, which could be sizeable with long selectors. */
  k = curlx_uztosz(len);

  for(;;) {
    result = Curl_write(conn, sockfd, sel, k, &amount);
    if(!result) { /* Which may not have written it all! */
      result = Curl_client_write(conn, CLIENTWRITE_HEADER, sel, amount);
      if(result)
        break;

      k -= amount;
      sel += amount;
      if(k < 1)
        break; /* but it did write it all */
    }
    else
      break;

    /* Don't busyloop. The entire loop thing is a work-around as it causes a
       BLOCKING behavior which is a NO-NO. This function should rather be
       split up in a do and a doing piece where the pieces that aren't
       possible to send now will be sent in the doing function repeatedly
       until the entire request is sent.

       Wait a while for the socket to be writable. Note that this doesn't
       acknowledge the timeout.
    */
    if(SOCKET_WRITABLE(sockfd, 100) < 0) {
      result = CURLE_SEND_ERROR;
      break;
    }
  }

  free(sel_org);

  if(!result)
    /* We can use Curl_sendf to send the terminal \r\n relatively safely and
       save allocing another string/doing another _write loop. */
    result = Curl_sendf(sockfd, conn, "\r\n");
  if(result) {
    failf(data, "Failed sending Gopher request");
    return result;
  }
  result = Curl_client_write(conn, CLIENTWRITE_HEADER, (char *)"\r\n", 2);
  if(result)
    return result;

  Curl_setup_transfer(data, FIRSTSOCKET, -1, FALSE, -1);
  return CURLE_OK;
}